

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

Error __thiscall asmjit::Assembler::embed(Assembler *this,void *data,uint32_t size)

{
  Error EVar1;
  uint in_EDX;
  void *in_RSI;
  CodeEmitter *in_RDI;
  CodeHolder *unaff_retaddr;
  Error err;
  size_t in_stack_00000080;
  void *in_stack_00000088;
  Logger *in_stack_00000090;
  CodeEmitter *this_00;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  if (in_RDI->_lastError == 0) {
    if ((in_RDI[1]._codeInfo._baseAddress - (long)in_RDI[1]._code < (ulong)in_EDX) &&
       (this_00 = in_RDI,
       EVar1 = CodeHolder::growBuffer
                         (unaff_retaddr,(CodeBuffer *)in_RDI,
                          CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0)), EVar1 != 0
       )) {
      EVar1 = CodeEmitter::setLastError
                        (this_00,(Error)((ulong)in_RSI >> 0x20),(char *)CONCAT44(in_EDX,EVar1));
    }
    else {
      memcpy(in_RDI[1]._code,in_RSI,(ulong)in_EDX);
      in_RDI[1]._code =
           (CodeHolder *)((long)&((in_RDI[1]._code)->_codeInfo)._archInfo.field_0 + (ulong)in_EDX);
      if ((in_RDI->_globalOptions & 4) != 0) {
        Logger::logBinary(in_stack_00000090,in_stack_00000088,in_stack_00000080);
      }
      EVar1 = 0;
    }
  }
  else {
    EVar1 = in_RDI->_lastError;
  }
  return EVar1;
}

Assistant:

Error Assembler::embed(const void* data, uint32_t size) {
  if (_lastError) return _lastError;

  if (getRemainingSpace() < size) {
    Error err = _code->growBuffer(&_section->_buffer, size);
    if (ASMJIT_UNLIKELY(err != kErrorOk)) return setLastError(err);
  }

  ::memcpy(_bufferPtr, data, size);
  _bufferPtr += size;

#if !defined(ASMJIT_DISABLE_LOGGING)
  if (_globalOptions & kOptionLoggingEnabled)
    _code->_logger->logBinary(data, size);
#endif // !ASMJIT_DISABLE_LOGGING

  return kErrorOk;
}